

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::ImageBarrierCase::iterate(ImageBarrierCase *this)

{
  GLsizei GVar1;
  glBindTextureFunc p_Var2;
  glTexStorage2DFunc p_Var3;
  glBindImageTextureFunc p_Var4;
  glGetProgramResourceIndexFunc p_Var5;
  glBindBufferFunc p_Var6;
  glBindBufferBaseFunc p_Var7;
  glUseProgramFunc p_Var8;
  glUniform1uiFunc p_Var9;
  glGetUniformLocationFunc p_Var10;
  glDispatchComputeFunc p_Var11;
  int iVar12;
  bool bVar13;
  ContextType type;
  GLSLVersion version;
  int iVar14;
  deUint32 dVar15;
  GLenum GVar16;
  GLint GVar17;
  GLuint GVar18;
  RenderContext *pRVar19;
  char *pcVar20;
  ostream *poVar21;
  ProgramSources *pPVar22;
  undefined4 extraout_var;
  TestLog *pTVar23;
  TestError *pTVar24;
  MessageBuilder *pMVar25;
  int *piVar26;
  void *pvVar27;
  GLuint *pGVar28;
  allocator<char> local_af9;
  string local_af8;
  MessageBuilder local_ad8;
  int local_954;
  uint local_950;
  int ndx;
  deUint32 ref;
  deUint32 res;
  BufferMemMap bufMap_1;
  InterfaceVariableInfo valueInfo;
  deUint32 valueIndex;
  int blockSize_1;
  deUint32 blockIndex_1;
  BufferMemMap bufMap;
  int blockSize;
  deUint32 blockIndex;
  undefined4 local_72c;
  undefined1 local_728 [4];
  deUint32 baseValue;
  Buffer outputBuffer;
  Texture tempTexture;
  Functions *gl;
  ShaderSource local_6d0;
  ProgramSources local_6a8;
  undefined1 local_5d8 [8];
  ShaderProgram program1;
  ShaderSource local_4e8;
  ProgramSources local_4c0;
  undefined1 local_3f0 [8];
  ShaderProgram program0;
  ostringstream src1;
  ostringstream local_198 [8];
  ostringstream src0;
  char *glslVersionDeclaration;
  GLSLVersion glslVersion;
  ImageBarrierCase *this_local;
  Functions *gl_00;
  
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar19->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar20 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar21 = std::operator<<((ostream *)local_198,pcVar20);
  poVar21 = std::operator<<(poVar21,"\n");
  std::operator<<(poVar21,
                  "layout (local_size_x = 1) in;\nuniform uint u_baseVal;\nlayout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\nvoid main (void) {\n    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n}\n"
                 );
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&program0.m_program.m_info.linkTimeUs)
  ;
  poVar21 = std::operator<<((ostream *)&program0.m_program.m_info.linkTimeUs,pcVar20);
  poVar21 = std::operator<<(poVar21,"\n");
  std::operator<<(poVar21,
                  "layout (local_size_x = 1) in;\nlayout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\nlayout(binding = 0) buffer Output {\n    coherent uint sum;\n};\nvoid main (void) {\n    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n    atomicAdd(sum, value);\n}\n"
                 );
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_4c0);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource
            ((ComputeSource *)&local_4e8,(string *)&program1.m_program.m_info.linkTimeUs);
  pPVar22 = glu::ProgramSources::operator<<(&local_4c0,&local_4e8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3f0,pRVar19,pPVar22);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4e8);
  std::__cxx11::string::~string((string *)&program1.m_program.m_info.linkTimeUs);
  glu::ProgramSources::~ProgramSources(&local_4c0);
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_6a8);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_6d0,(string *)&gl);
  pPVar22 = glu::ProgramSources::operator<<(&local_6a8,&local_6d0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_5d8,pRVar19,pPVar22);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_6d0);
  std::__cxx11::string::~string((string *)&gl);
  glu::ProgramSources::~ProgramSources(&local_6a8);
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar14 = (*pRVar19->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar14);
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&outputBuffer.super_ObjectWrapper.m_object,
             pRVar19);
  pRVar19 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)local_728,pRVar19);
  local_72c = 0x7f;
  pTVar23 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pTVar23 = glu::operator<<(pTVar23,(ShaderProgram *)local_3f0);
  glu::operator<<(pTVar23,(ShaderProgram *)local_5d8);
  bVar13 = glu::ShaderProgram::isOk((ShaderProgram *)local_3f0);
  if ((!bVar13) || (bVar13 = glu::ShaderProgram::isOk((ShaderProgram *)local_5d8), !bVar13)) {
    pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar24,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x582);
    __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pTVar23 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<
            ((MessageBuilder *)&blockSize,pTVar23,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar25 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&blockSize,(char (*) [14])"Work groups: ");
  pMVar25 = tcu::MessageBuilder::operator<<(pMVar25,&this->m_workSize);
  tcu::MessageBuilder::operator<<(pMVar25,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&blockSize);
  p_Var2 = gl_00->bindTexture;
  dVar15 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
  (*p_Var2)(0xde1,dVar15);
  p_Var3 = gl_00->texStorage2D;
  piVar26 = tcu::Vector<int,_2>::operator[](&this->m_workSize,0);
  GVar1 = *piVar26;
  piVar26 = tcu::Vector<int,_2>::operator[](&this->m_workSize,1);
  (*p_Var3)(0xde1,1,0x8236,GVar1,*piVar26);
  (*gl_00->texParameteri)(0xde1,0x2801,0x2600);
  (*gl_00->texParameteri)(0xde1,0x2800,0x2600);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Uploading image data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x58b);
  p_Var4 = gl_00->bindImageTexture;
  dVar15 = glu::ObjectWrapper::operator*
                     ((ObjectWrapper *)&outputBuffer.super_ObjectWrapper.m_object);
  (*p_Var4)(2,dVar15,0,'\0',0,0x88ba,0x8236);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Image setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x58f);
  p_Var5 = gl_00->getProgramResourceIndex;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  bufMap.m_ptr._4_4_ = (*p_Var5)(dVar15,0x92e6,"Output");
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  bufMap.m_ptr._0_4_ = glu::getProgramResourceInt(gl_00,dVar15,0x92e6,bufMap.m_ptr._4_4_,0x9303);
  p_Var6 = gl_00->bindBuffer;
  dVar15 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_728);
  (*p_Var6)(0x90d2,dVar15);
  (*gl_00->bufferData)(0x90d2,(long)(int)bufMap.m_ptr,(void *)0x0,0x88e1);
  BufferMemMap::BufferMemMap((BufferMemMap *)&blockSize_1,gl_00,0x90d2,0,(int)bufMap.m_ptr,2);
  pvVar27 = BufferMemMap::getPtr((BufferMemMap *)&blockSize_1);
  deMemset(pvVar27,0,(long)(int)bufMap.m_ptr);
  BufferMemMap::~BufferMemMap((BufferMemMap *)&blockSize_1);
  p_Var7 = gl_00->bindBufferBase;
  dVar15 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_728);
  (*p_Var7)(0x90d2,0,dVar15);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x59f);
  p_Var8 = gl_00->useProgram;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  (*p_Var8)(dVar15);
  p_Var9 = gl_00->uniform1ui;
  p_Var10 = gl_00->getUniformLocation;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_3f0);
  GVar17 = (*p_Var10)(dVar15,"u_baseVal");
  (*p_Var9)(GVar17,0x7f);
  p_Var11 = gl_00->dispatchCompute;
  pGVar28 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_workSize,0);
  GVar18 = *pGVar28;
  pGVar28 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_workSize,1);
  (*p_Var11)(GVar18,*pGVar28,1);
  (*gl_00->memoryBarrier)(0x20);
  p_Var8 = gl_00->useProgram;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  (*p_Var8)(dVar15);
  p_Var11 = gl_00->dispatchCompute;
  pGVar28 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_workSize,0);
  GVar18 = *pGVar28;
  pGVar28 = (GLuint *)tcu::Vector<int,_2>::operator[](&this->m_workSize,1);
  (*p_Var11)(GVar18,*pGVar28,1);
  GVar16 = (*gl_00->getError)();
  glu::checkError(GVar16,"Failed to dispatch commands",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x5a9);
  p_Var5 = gl_00->getProgramResourceIndex;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  GVar18 = (*p_Var5)(dVar15,0x92e6,"Output");
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  iVar14 = glu::getProgramResourceInt(gl_00,dVar15,0x92e6,GVar18,0x9303);
  p_Var5 = gl_00->getProgramResourceIndex;
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  GVar18 = (*p_Var5)(dVar15,0x92e5,"sum");
  dVar15 = glu::ShaderProgram::getProgram((ShaderProgram *)local_5d8);
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&bufMap_1.m_ptr,gl_00,dVar15,0x92e5,GVar18);
  BufferMemMap::BufferMemMap((BufferMemMap *)&ref,gl_00,0x90d2,0,iVar14,1);
  pvVar27 = BufferMemMap::getPtr((BufferMemMap *)&ref);
  ndx = *(int *)((long)pvVar27 + (ulong)valueInfo.type);
  local_950 = 0;
  local_954 = 0;
  while( true ) {
    iVar12 = local_954;
    piVar26 = tcu::Vector<int,_2>::operator[](&this->m_workSize,0);
    iVar14 = *piVar26;
    piVar26 = tcu::Vector<int,_2>::operator[](&this->m_workSize,1);
    if (iVar14 * *piVar26 <= iVar12) break;
    local_950 = local_954 + 0x7f + local_950;
    local_954 = local_954 + 1;
  }
  if (ndx == local_950) {
    BufferMemMap::~BufferMemMap((BufferMemMap *)&ref);
    glu::InterfaceVariableInfo::~InterfaceVariableInfo((InterfaceVariableInfo *)&bufMap_1.m_ptr);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)1> *)local_728);
    glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
              ((TypedObjectWrapper<(glu::ObjectType)0> *)&outputBuffer.super_ObjectWrapper.m_object)
    ;
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_5d8);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3f0);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&program0.m_program.m_info.linkTimeUs);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    return STOP;
  }
  pTVar23 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_ad8,pTVar23,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar25 = tcu::MessageBuilder::operator<<
                      (&local_ad8,(char (*) [36])"ERROR: comparison failed, expected ");
  pMVar25 = tcu::MessageBuilder::operator<<(pMVar25,&local_950);
  pMVar25 = tcu::MessageBuilder::operator<<(pMVar25,(char (*) [7])0xf925e6);
  pMVar25 = tcu::MessageBuilder::operator<<(pMVar25,(uint *)&ndx);
  tcu::MessageBuilder::operator<<(pMVar25,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_ad8);
  pTVar24 = (TestError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"Comparison failed",&local_af9);
  tcu::TestError::TestError(pTVar24,&local_af8);
  __cxa_throw(pTVar24,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion			glslVersion				= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		const char* const			glslVersionDeclaration	= getGLSLVersionDeclaration(glslVersion);

		std::ostringstream src0;
		src0 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "uniform uint u_baseVal;\n"
						  "layout(r32ui, binding = 2) writeonly uniform highp uimage2D u_img;\n"
						  "void main (void) {\n"
						  "    uint offset = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
						  "    imageStore(u_img, ivec2(gl_WorkGroupID.xy), uvec4(offset+u_baseVal, 0, 0, 0));\n"
				"}\n";

		std::ostringstream src1;
		src1 << glslVersionDeclaration << "\n"
			 << "layout (local_size_x = 1) in;\n"
						  "layout(r32ui, binding = 2) readonly uniform highp uimage2D u_img;\n"
						  "layout(binding = 0) buffer Output {\n"
						  "    coherent uint sum;\n"
						  "};\n"
						  "void main (void) {\n"
						  "    uint value = imageLoad(u_img, ivec2(gl_WorkGroupID.xy)).x;\n"
						  "    atomicAdd(sum, value);\n"
				"}\n";

		const ShaderProgram			program0		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src0.str()));
		const ShaderProgram			program1		(m_context.getRenderContext(), ProgramSources() << ComputeSource(src1.str()));

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Texture				tempTexture		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const deUint32				baseValue		= 127;

		m_testCtx.getLog() << program0 << program1;
		if (!program0.isOk() || !program1.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		// Temp texture setup
		gl.bindTexture(GL_TEXTURE_2D, *tempTexture);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32UI, m_workSize[0], m_workSize[1]);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading image data failed");

		// Bind to unit 2
		gl.bindImageTexture(2, *tempTexture, 0, GL_FALSE, 0, GL_READ_WRITE, GL_R32UI);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Image setup failed");

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_WRITE_BIT);
				deMemset(bufMap.getPtr(), 0, blockSize);
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.useProgram(program0.getProgram());
		gl.uniform1ui(gl.getUniformLocation(program0.getProgram(), "u_baseVal"), baseValue);
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		gl.memoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);
		gl.useProgram(program1.getProgram());
		gl.dispatchCompute(m_workSize[0], m_workSize[1], 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to dispatch commands");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program1.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program1.getProgram(), GL_BUFFER_VARIABLE, "sum");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program1.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			const deUint32				res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset));
			deUint32					ref			= 0;

			for (int ndx = 0; ndx < m_workSize[0]*m_workSize[1]; ndx++)
				ref += baseValue + (deUint32)ndx;

			if (res != ref)
			{
				m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed, expected " << ref << ", got " << res << TestLog::EndMessage;
				throw tcu::TestError("Comparison failed");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}